

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O1

AActor * COPY_AAPTR(AActor *origin,int selector)

{
  player_t *ppVar1;
  AActor *pAVar2;
  ulong uVar3;
  uint uVar4;
  FTranslatedLineTarget t;
  AActor *local_20;
  
  if (selector == 0) {
    return origin;
  }
  if (origin != (AActor *)0x0) {
    ppVar1 = origin->player;
    if (ppVar1 != (player_t *)0x0) {
      if ((selector & 0x30U) == 0x20) {
        pAVar2 = (ppVar1->ConversationNPC).field_0.p;
        if (pAVar2 == (AActor *)0x0) {
          return (AActor *)0x0;
        }
        if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (ppVar1->ConversationNPC).field_0.p = (AActor *)0x0;
          return (AActor *)0x0;
        }
        return pAVar2;
      }
      if ((selector & 0x30U) == 0x10) goto LAB_00467e6a;
    }
    uVar4 = selector & 0xc00e;
    if (uVar4 < 8) {
      if (uVar4 == 2) {
        pAVar2 = (origin->target).field_0.p;
        if (pAVar2 == (AActor *)0x0) {
          return (AActor *)0x0;
        }
        if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (origin->target).field_0.p = (AActor *)0x0;
          return (AActor *)0x0;
        }
        return pAVar2;
      }
      if (uVar4 == 4) {
        pAVar2 = (origin->master).field_0.p;
        if (pAVar2 == (AActor *)0x0) {
          return (AActor *)0x0;
        }
        if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (origin->master).field_0.p = (AActor *)0x0;
          return (AActor *)0x0;
        }
        return pAVar2;
      }
    }
    else {
      if (uVar4 == 8) {
        pAVar2 = (origin->tracer).field_0.p;
        if (pAVar2 == (AActor *)0x0) {
          return (AActor *)0x0;
        }
        if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (origin->tracer).field_0.p = (AActor *)0x0;
          return (AActor *)0x0;
        }
        return pAVar2;
      }
      if (uVar4 == 0x4000) {
        if (origin->FriendPlayer == 0) {
          return (AActor *)0x0;
        }
        uVar3 = (ulong)(origin->FriendPlayer - 1);
        if (playeringame[uVar3] != true) {
          return (AActor *)0x0;
        }
        return (&players)[uVar3 * 0x54];
      }
      if (uVar4 == 0x8000) {
LAB_00467e6a:
        P_BulletSlope((AActor *)&stack0xffffffffffffffd8,(FTranslatedLineTarget *)origin,
                      (int)&stack0xffffffffffffffe0);
        return local_20;
      }
    }
  }
  uVar4 = selector & 0x3fc1;
  if (uVar4 < 0x200) {
    if (uVar4 < 0x80) {
      if (uVar4 != 1) {
        if (uVar4 != 0x40) {
          return origin;
        }
        if (playeringame[0]) {
          return players;
        }
      }
    }
    else if (uVar4 == 0x80) {
      if (playeringame[1]) {
        return DAT_00a39530;
      }
    }
    else {
      if (uVar4 != 0x100) {
        return origin;
      }
      if (playeringame[2]) {
        return DAT_00a397d0;
      }
    }
  }
  else if (uVar4 < 0x800) {
    if (uVar4 == 0x200) {
      if (playeringame[3]) {
        return DAT_00a39a70;
      }
    }
    else {
      if (uVar4 != 0x400) {
        return origin;
      }
      if (playeringame[4]) {
        return DAT_00a39d10;
      }
    }
  }
  else if (uVar4 == 0x800) {
    if (playeringame[5]) {
      return DAT_00a39fb0;
    }
  }
  else if (uVar4 == 0x1000) {
    if (playeringame[6]) {
      return DAT_00a3a250;
    }
  }
  else {
    if (uVar4 != 0x2000) {
      return origin;
    }
    if (playeringame[7]) {
      return DAT_00a3a4f0;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *COPY_AAPTR(AActor *origin, int selector)
{
	if (selector == AAPTR_DEFAULT) return origin;

	FTranslatedLineTarget t;

	if (origin)
	{
		if (origin->player)
		{
			switch (selector & AAPTR_PLAYER_SELECTORS)
			{
			case AAPTR_PLAYER_GETTARGET:
				P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
				return t.linetarget;

			case AAPTR_PLAYER_GETCONVERSATION:
				return origin->player->ConversationNPC;
			}
		}

		switch (selector & AAPTR_GENERAL_SELECTORS)
		{
		case AAPTR_TARGET: return origin->target;
		case AAPTR_MASTER: return origin->master;
		case AAPTR_TRACER: return origin->tracer;
		case AAPTR_FRIENDPLAYER:
			return origin->FriendPlayer ? AAPTR_RESOLVE_PLAYERNUM(origin->FriendPlayer - 1) : NULL;

		case AAPTR_GET_LINETARGET:
			P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
			return t.linetarget;
		}
	}

	switch (selector & AAPTR_STATIC_SELECTORS)
	{
		case AAPTR_PLAYER1: return AAPTR_RESOLVE_PLAYERNUM(0);
		case AAPTR_PLAYER2: return AAPTR_RESOLVE_PLAYERNUM(1);
		case AAPTR_PLAYER3: return AAPTR_RESOLVE_PLAYERNUM(2);
		case AAPTR_PLAYER4: return AAPTR_RESOLVE_PLAYERNUM(3);
		case AAPTR_PLAYER5: return AAPTR_RESOLVE_PLAYERNUM(4);
		case AAPTR_PLAYER6: return AAPTR_RESOLVE_PLAYERNUM(5);
		case AAPTR_PLAYER7: return AAPTR_RESOLVE_PLAYERNUM(6);
		case AAPTR_PLAYER8: return AAPTR_RESOLVE_PLAYERNUM(7);
		case AAPTR_NULL: return NULL;
	}

	return origin;
}